

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf_v4::clear(xr_ogf_v4 *this)

{
  xr_ogf::clear(&this->super_xr_ogf);
  xr_swibuf::clear(&this->m_swib);
  (this->m_source)._M_string_length = 0;
  *(this->m_source)._M_dataplus._M_p = '\0';
  (this->m_export_tool)._M_string_length = 0;
  *(this->m_export_tool)._M_dataplus._M_p = '\0';
  if (this->m_fast != (xr_ogf *)0x0) {
    (*(this->m_fast->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])();
  }
  this->m_fast = (xr_ogf *)0x0;
  return;
}

Assistant:

void xr_ogf_v4::clear()
{
	xr_ogf::clear();
	m_swib.clear();
	m_source.clear();
	m_export_tool.clear();
	delete m_fast;
	m_fast = 0;
}